

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall sptk::Matrix::Matrix(Matrix *this,int num_row,int num_column)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_0010fd00;
  if (num_row < 1) {
    num_row = 0;
  }
  this->num_row_ = num_row;
  iVar1 = 0;
  if (0 < num_column) {
    iVar1 = num_column;
  }
  this->num_column_ = iVar1;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&this->data_,(ulong)(uint)(num_row * iVar1));
  std::vector<double_*,_std::allocator<double_*>_>::resize(&this->index_,(long)this->num_row_);
  iVar1 = this->num_column_;
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->num_row_;
  if (this->num_row_ < 1) {
    uVar2 = uVar3;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] =
         (double *)
         ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + uVar3);
    uVar3 = uVar3 + (long)iVar1 * 8;
  }
  return;
}

Assistant:

Matrix::Matrix(int num_row, int num_column)
    : num_row_(num_row < 0 ? 0 : num_row),
      num_column_(num_column < 0 ? 0 : num_column) {
  data_.resize(num_row_ * num_column_);
  index_.resize(num_row_);

  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}